

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

void ft_stroke_border_init(PVG_FT_StrokeBorder border)

{
  PVG_FT_StrokeBorder border_local;
  
  border->points = (PVG_FT_Vector *)0x0;
  border->tags = (PVG_FT_Byte *)0x0;
  border->num_points = 0;
  border->max_points = 0;
  border->start = -1;
  border->valid = '\0';
  return;
}

Assistant:

static void ft_stroke_border_init(PVG_FT_StrokeBorder border)
{
    border->points = NULL;
    border->tags = NULL;

    border->num_points = 0;
    border->max_points = 0;
    border->start = -1;
    border->valid = FALSE;
}